

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_evictk(ASMState *as)

{
  uint uVar1;
  uint uVar2;
  IRRef ref_1;
  Reg r_1;
  IRRef ref;
  Reg r;
  RegSet work;
  ASMState *as_local;
  
  ref = (as->freeset ^ 0xffffffff) & 0xffff0000;
  while( true ) {
    if (ref == 0) {
      ref = (as->freeset ^ 0xffffffff) & 0xbfef;
      while( true ) {
        if (ref == 0) {
          return;
        }
        uVar1 = 0;
        for (uVar2 = ref; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
          uVar1 = uVar1 + 1;
        }
        uVar2 = as->cost[uVar1] & 0xffff;
        if (((uVar2 < 0x8001) && (uVar2 < 0x8000)) && (ra_rematk(as,uVar2), as->mcp < as->mclim))
        break;
        ref = (1 << ((byte)uVar1 & 0x1f) ^ 0xffffffffU) & ref;
      }
      asm_mclimit(as);
    }
    uVar1 = 0;
    for (uVar2 = ref; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    uVar2 = as->cost[uVar1] & 0xffff;
    if (((uVar2 < 0x8001) && (uVar2 < 0x8000)) && (ra_rematk(as,uVar2), as->mcp < as->mclim)) break;
    ref = (1 << ((byte)uVar1 & 0x1f) ^ 0xffffffffU) & ref;
  }
  asm_mclimit(as);
}

Assistant:

static void ra_evictk(ASMState *as)
{
  RegSet work;
#if !LJ_SOFTFP
  work = ~as->freeset & RSET_FPR;
  while (work) {
    Reg r = rset_pickbot(work);
    IRRef ref = regcost_ref(as->cost[r]);
    if (emit_canremat(ref) && irref_isk(ref)) {
      ra_rematk(as, ref);
      checkmclim(as);
    }
    rset_clear(work, r);
  }
#endif
  work = ~as->freeset & RSET_GPR;
  while (work) {
    Reg r = rset_pickbot(work);
    IRRef ref = regcost_ref(as->cost[r]);
    if (emit_canremat(ref) && irref_isk(ref)) {
      ra_rematk(as, ref);
      checkmclim(as);
    }
    rset_clear(work, r);
  }
}